

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ImVec2 size_expected;
  ImVec2 local_30;
  undefined1 local_28 [16];
  undefined1 extraout_var [56];
  
  IVar1 = *corner_target;
  auVar5._8_8_ = 0;
  auVar5._0_4_ = IVar1.x;
  auVar5._4_4_ = IVar1.y;
  IVar2 = window->Pos;
  auVar8._8_8_ = 0;
  auVar8._0_4_ = IVar2.x;
  auVar8._4_4_ = IVar2.y;
  auVar8 = vsubps_avx(auVar8,auVar5);
  fVar3 = (*corner_norm).x;
  fVar4 = (*corner_norm).y;
  local_28._0_4_ = auVar8._0_4_ * fVar3 + IVar1.x;
  local_28._4_4_ = auVar8._4_4_ * fVar4 + IVar1.y;
  local_28._8_4_ = auVar8._8_4_ * 0.0 + 0.0;
  local_28._12_4_ = auVar8._12_4_ * 0.0 + 0.0;
  auVar9._0_4_ = IVar2.x + (window->Size).x;
  auVar9._4_4_ = IVar2.y + (window->Size).y;
  auVar9._8_8_ = 0;
  auVar8 = vsubps_avx(auVar5,auVar9);
  auVar6._0_4_ = auVar8._0_4_ * fVar3 + auVar9._0_4_;
  auVar6._4_4_ = auVar8._4_4_ * fVar4 + auVar9._4_4_;
  auVar6._8_4_ = auVar8._8_4_ * 0.0 + 0.0;
  auVar6._12_4_ = auVar8._12_4_ * 0.0 + 0.0;
  auVar8 = vsubps_avx(auVar6,local_28);
  local_30 = (ImVec2)vmovlps_avx(auVar8);
  auVar7._0_8_ = CalcWindowSizeAfterConstraint(window,&local_30);
  auVar7._8_56_ = extraout_var;
  IVar1 = (ImVec2)vmovlps_avx(local_28);
  *out_pos = IVar1;
  if ((corner_norm->x == 0.0) && (!NAN(corner_norm->x))) {
    out_pos->x = out_pos->x - (auVar7._0_4_ - local_30.x);
  }
  if ((corner_norm->y == 0.0) && (!NAN(corner_norm->y))) {
    auVar8 = vmovshdup_avx(auVar7._0_16_);
    out_pos->y = out_pos->y - (auVar8._0_4_ - local_30.y);
  }
  IVar1 = (ImVec2)vmovlps_avx(auVar7._0_16_);
  *out_size = IVar1;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}